

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O0

bool __thiscall
ON_OffsetSurfaceFunction::SetSideTangency(ON_OffsetSurfaceFunction *this,int side,bool bEnable)

{
  bool local_16;
  bool rc;
  bool bEnable_local;
  int side_local;
  ON_OffsetSurfaceFunction *this_local;
  
  local_16 = false;
  if ((-1 < side) && (side < 4)) {
    this->m_bZeroSideDerivative[side] = (bool)(-bEnable & 1);
    this->m_bValid = false;
    local_16 = true;
  }
  return local_16;
}

Assistant:

bool ON_OffsetSurfaceFunction::SetSideTangency(
  int side,
  bool bEnable
  )
{
  bool rc = false;
  if ( 0 <= side && side < 4 )
  {
    m_bZeroSideDerivative[side] = bEnable?true:false;
    m_bValid = false;
    rc = true;
  }
  return rc;
}